

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O0

void general_hash_test(PCryptoHashType type,psize hash_len,pchar *msg1,pchar *msg2,puchar *etalon1,
                      puchar *etalon2,puchar *etalon3,pchar *hash1,pchar *hash2,pchar *hash3,
                      pchar *hash_stress)

{
  psize pVar1;
  puchar *ppVar2;
  PCryptoHashType PVar3;
  int iVar4;
  pchar *ppVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  uint local_78;
  int local_74;
  uint i_5;
  int i_4;
  int i_3;
  uint i_2;
  uint i_1;
  int i;
  puchar *hash_dig;
  pchar *long_str;
  pchar *hash_str;
  psize dig_len;
  PCryptoHash *crypto_hash;
  puchar *etalon2_local;
  puchar *etalon1_local;
  pchar *msg2_local;
  pchar *msg1_local;
  psize hash_len_local;
  PCryptoHashType type_local;
  
  crypto_hash = (PCryptoHash *)etalon2;
  etalon2_local = etalon1;
  etalon1_local = (puchar *)msg2;
  msg2_local = msg1;
  msg1_local = (pchar *)hash_len;
  hash_len_local._4_4_ = type;
  dig_len = p_crypto_hash_new(type);
  ppVar5 = (pchar *)p_crypto_hash_get_length(dig_len);
  if (ppVar5 != msg1_local) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x4b);
    exit(-1);
  }
  PVar3 = p_crypto_hash_get_type(dig_len);
  if (PVar3 != hash_len_local._4_4_) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x4c);
    exit(-1);
  }
  lVar6 = p_crypto_hash_get_string(dig_len);
  if (lVar6 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x4f);
    exit(-1);
  }
  p_crypto_hash_reset(dig_len);
  p_free(lVar6);
  lVar6 = p_malloc0(msg1_local);
  if (lVar6 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x54);
    exit(-1);
  }
  lVar7 = p_malloc0(10000);
  ppVar5 = msg2_local;
  pVar1 = dig_len;
  if (lVar7 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x57);
    exit(-1);
  }
  for (i_2 = 0; (int)i_2 < 10000; i_2 = i_2 + 1) {
    *(char *)(lVar7 + (int)i_2) = (char)((int)i_2 % 0x14) + 'a';
  }
  sVar8 = strlen(msg2_local);
  p_crypto_hash_update(pVar1,ppVar5,sVar8);
  pcVar9 = (char *)p_crypto_hash_get_string(dig_len);
  iVar4 = strcmp(pcVar9,hash1);
  if (iVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x61);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar9);
  p_crypto_hash_reset(dig_len);
  ppVar5 = msg2_local;
  pVar1 = dig_len;
  hash_str = msg1_local;
  sVar8 = strlen(msg2_local);
  p_crypto_hash_update(pVar1,ppVar5,sVar8);
  p_crypto_hash_get_digest(dig_len,lVar6,&hash_str);
  if (hash_str != msg1_local) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  for (i_3 = 0; (pchar *)(ulong)(uint)i_3 < msg1_local; i_3 = i_3 + 1) {
    if (*(puchar *)(lVar6 + (ulong)(uint)i_3) != etalon2_local[(uint)i_3]) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
             ,0x6e);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
  }
  p_crypto_hash_reset(dig_len);
  ppVar2 = etalon1_local;
  pVar1 = dig_len;
  sVar8 = strlen((char *)etalon1_local);
  p_crypto_hash_update(pVar1,ppVar2,sVar8);
  pcVar9 = (char *)p_crypto_hash_get_string(dig_len);
  iVar4 = strcmp(pcVar9,hash2);
  if (iVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x77);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar9);
  p_crypto_hash_reset(dig_len);
  ppVar2 = etalon1_local;
  pVar1 = dig_len;
  hash_str = msg1_local;
  sVar8 = strlen((char *)etalon1_local);
  p_crypto_hash_update(pVar1,ppVar2,sVar8);
  p_crypto_hash_get_digest(dig_len,lVar6,&hash_str);
  if (hash_str != msg1_local) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x81);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  for (i_4 = 0; (pchar *)(ulong)(uint)i_4 < msg1_local; i_4 = i_4 + 1) {
    if (*(PCryptoHash *)(lVar6 + (ulong)(uint)i_4) != crypto_hash[(uint)i_4]) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
             ,0x84);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
  }
  p_crypto_hash_reset(dig_len);
  for (i_5 = 0; (int)i_5 < 1000000; i_5 = i_5 + 1) {
    p_crypto_hash_update(dig_len,"a",1);
  }
  pcVar9 = (char *)p_crypto_hash_get_string(dig_len);
  iVar4 = strcmp(pcVar9,hash3);
  if (iVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x90);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar9);
  p_crypto_hash_reset(dig_len);
  hash_str = msg1_local;
  for (local_74 = 0; local_74 < 1000000; local_74 = local_74 + 1) {
    p_crypto_hash_update(dig_len,"a",1);
  }
  p_crypto_hash_get_digest(dig_len,lVar6,&hash_str);
  if (hash_str != msg1_local) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0x9b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  for (local_78 = 0; (pchar *)(ulong)local_78 < msg1_local; local_78 = local_78 + 1) {
    if (*(puchar *)(lVar6 + (ulong)local_78) != etalon3[local_78]) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
             ,0x9e);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
  }
  p_crypto_hash_reset(dig_len);
  p_crypto_hash_update(dig_len,lVar7,10000);
  pcVar9 = (char *)p_crypto_hash_get_string(dig_len);
  iVar4 = strcmp(pcVar9,hash_stress);
  if (iVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xa6);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar9);
  p_crypto_hash_reset(dig_len);
  p_free(lVar7);
  p_free(lVar6);
  p_crypto_hash_free(dig_len);
  return;
}

Assistant:

static void
general_hash_test (PCryptoHashType	type,
		   psize		hash_len,
		   const pchar		*msg1,
		   const pchar		*msg2,
		   const puchar		*etalon1,
		   const puchar		*etalon2,
		   const puchar		*etalon3,
		   const pchar		*hash1,
		   const pchar		*hash2,
		   const pchar		*hash3,
		   const pchar		*hash_stress)
{
	PCryptoHash	*crypto_hash;
	psize		dig_len;
	pchar		*hash_str;
	pchar		*long_str;
	puchar		*hash_dig;

	crypto_hash = p_crypto_hash_new (type);

	P_TEST_REQUIRE ((psize) p_crypto_hash_get_length (crypto_hash) == hash_len);
	P_TEST_REQUIRE (p_crypto_hash_get_type (crypto_hash) == type);

	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_REQUIRE (hash_str != NULL);
	p_crypto_hash_reset (crypto_hash);
	p_free (hash_str);

	hash_dig = (puchar *) p_malloc0 (hash_len);
	P_TEST_REQUIRE (hash_dig != NULL);

	long_str = (pchar *) p_malloc0 (PCRYPTO_STRESS_LENGTH);
	P_TEST_REQUIRE (long_str != NULL);

	for (int i = 0; i < PCRYPTO_STRESS_LENGTH; ++i)
		long_str[i] = (pchar) (97 + i % 20);

	/* Case 1 */

	/* Check string */
	p_crypto_hash_update (crypto_hash, (const puchar *) msg1, strlen (msg1));
	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_CHECK (strcmp (hash_str, hash1) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	p_crypto_hash_update (crypto_hash, (const puchar *) msg1, strlen (msg1));
	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);

	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon1[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Case 2 */

	/* Check string */
	p_crypto_hash_update (crypto_hash, (const puchar *) msg2, strlen (msg2));
	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_CHECK (strcmp (hash_str, hash2) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	p_crypto_hash_update (crypto_hash, (const puchar *) msg2, strlen (msg2));
	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);

	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon2[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Case 3 */

	/* Check string */
	for (int i = 0; i < PCRYPTO_MAX_UPDATES; ++i)
		p_crypto_hash_update (crypto_hash, (const puchar *) "a", 1);

	hash_str = p_crypto_hash_get_string (crypto_hash);

	P_TEST_CHECK (strcmp (hash_str, hash3) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	for (int i = 0; i < PCRYPTO_MAX_UPDATES; ++i)
		p_crypto_hash_update (crypto_hash, (const puchar *) "a", 1);

	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);
	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon3[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Stress test */
	p_crypto_hash_update (crypto_hash, (const puchar *) long_str, PCRYPTO_STRESS_LENGTH);
	hash_str = p_crypto_hash_get_string (crypto_hash);

	P_TEST_CHECK (strcmp (hash_str, hash_stress) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	p_free (long_str);
	p_free (hash_dig);
	p_crypto_hash_free (crypto_hash);
}